

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O0

void testing::internal::Log(LogSeverity severity,string *message,int stack_frames_to_skip)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  reference pcVar5;
  ostream *poVar6;
  UnitTest *this;
  undefined4 in_ECX;
  int skip_count;
  string local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30 [12];
  uint local_24;
  GTestMutexLock local_1d;
  int actual_to_skip;
  MutexLock l;
  string *psStack_18;
  int stack_frames_to_skip_local;
  string *message_local;
  LogSeverity severity_local;
  
  actual_to_skip = stack_frames_to_skip;
  psStack_18 = message;
  bVar1 = LogIsVisible(severity);
  if (bVar1) {
    GTestMutexLock::GTestMutexLock(&local_1d,(Mutex *)&g_log_mutex);
    if (severity == kWarning) {
      std::operator<<((ostream *)&std::cout,"\nGMOCK WARNING:");
    }
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) != 0) ||
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18), *pcVar4 != '\n')) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
    std::operator<<((ostream *)&std::cout,(string *)psStack_18);
    if (-1 < actual_to_skip) {
      local_24 = actual_to_skip + 1;
      bVar2 = std::__cxx11::string::empty();
      skip_count = CONCAT31((int3)((uint)in_ECX >> 8),bVar2);
      bVar1 = false;
      if ((bVar2 & 1) == 0) {
        std::__cxx11::string::rbegin();
        pcVar5 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(local_30);
        bVar1 = *pcVar5 != '\n';
      }
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"\n");
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"Stack trace:\n");
      this = UnitTest::GetInstance();
      GetCurrentOsStackTraceExceptTop_abi_cxx11_
                (&local_50,(internal *)this,(UnitTest *)(ulong)local_24,skip_count);
      std::operator<<(poVar6,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

GTEST_API_ void Log(LogSeverity severity, const std::string& message,
                    int stack_frames_to_skip) {
  if (!LogIsVisible(severity))
    return;

  // Ensures that logs from different threads don't interleave.
  MutexLock l(&g_log_mutex);

  if (severity == kWarning) {
    // Prints a GMOCK WARNING marker to make the warnings easily searchable.
    std::cout << "\nGMOCK WARNING:";
  }
  // Pre-pends a new-line to message if it doesn't start with one.
  if (message.empty() || message[0] != '\n') {
    std::cout << "\n";
  }
  std::cout << message;
  if (stack_frames_to_skip >= 0) {
#ifdef NDEBUG
    // In opt mode, we have to be conservative and skip no stack frame.
    const int actual_to_skip = 0;
#else
    // In dbg mode, we can do what the caller tell us to do (plus one
    // for skipping this function's stack frame).
    const int actual_to_skip = stack_frames_to_skip + 1;
#endif  // NDEBUG

    // Appends a new-line to message if it doesn't end with one.
    if (!message.empty() && *message.rbegin() != '\n') {
      std::cout << "\n";
    }
    std::cout << "Stack trace:\n"
         << ::testing::internal::GetCurrentOsStackTraceExceptTop(
             ::testing::UnitTest::GetInstance(), actual_to_skip);
  }
  std::cout << ::std::flush;
}